

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O3

bool __thiscall TURBOLINECOUNT::CLineCount::countLines(CLineCount *this,tlc_linecount_t *linecount)

{
  pointer plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  char *__s;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  stat64 statbuf;
  allocator<char> local_121;
  long *local_120 [2];
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  stat64 local_c0;
  size_type __new_size;
  
  iVar5 = fstat64(this->m_fh,&local_c0);
  if (iVar5 == 0) {
    this->m_filesize = local_c0.st_size;
    if (local_c0.st_size == 0) {
      *linecount = 0;
      return true;
    }
    uVar10 = (this->m_parameters).buffersize;
    uVar9 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (local_c0.st_size + uVar10) - 1;
    iVar5 = (this->m_parameters).threadcount;
    iVar6 = SUB164(auVar3 / auVar2,0);
    __new_size = (size_type)iVar6;
    if ((long)iVar5 <= SUB168(auVar3 / auVar2,0)) {
      iVar6 = iVar5;
      __new_size = (long)iVar5;
    }
    this->m_actual_thread_count = iVar6;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_threads,__new_size);
    std::vector<long,_std::allocator<long>_>::resize
              (&this->m_threadlinecounts,(long)this->m_actual_thread_count);
    this->m_thread_fail = false;
    uVar7 = this->m_actual_thread_count;
    if (0 < (int)uVar7) {
      uVar9 = 0;
      do {
        bVar4 = createThread(this,uVar9);
        if (!bVar4) {
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,"failed to create counting thread","");
          this->m_lasterror = 10;
          std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0],local_f0[0] + 1);
          }
          this->m_thread_fail = true;
          this->m_actual_thread_count = uVar9;
          uVar7 = uVar9;
          break;
        }
        uVar9 = uVar9 + 1;
        uVar7 = this->m_actual_thread_count;
      } while ((int)uVar9 < (int)uVar7);
      if ((int)uVar7 < 1) {
        uVar9 = 0;
      }
      else {
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar5 = pthread_join((this->m_threads).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar11],(void **)0x0);
          uVar9 = uVar9 + (iVar5 == 0);
          lVar11 = lVar11 + 1;
          uVar7 = this->m_actual_thread_count;
        } while (lVar11 < (int)uVar7);
      }
    }
    if (this->m_thread_fail != false) {
      return false;
    }
    if (uVar9 == uVar7) {
      *linecount = 0;
      if (0 < (int)uVar9) {
        plVar1 = (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        lVar11 = 0;
        do {
          lVar11 = lVar11 + plVar1[uVar10];
          *linecount = lVar11;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        return true;
      }
      return true;
    }
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"thread join failed","");
    this->m_lasterror = 10;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    local_e0[0] = local_120[0];
    if (local_120[0] == local_110) {
      return false;
    }
  }
  else {
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    __s = strerror(iVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,__s,&local_121);
    this->m_lasterror = iVar5;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    local_110[0] = local_d0[0];
    if (local_e0[0] == local_d0) {
      return false;
    }
  }
  operator_delete(local_e0[0],local_110[0] + 1);
  return false;
}

Assistant:

bool CLineCount::countLines(tlc_linecount_t & linecount)
{
	// Determine file size
#ifdef _WIN32
	LARGE_INTEGER li;
	if (!GetFileSizeEx(m_fh, &li))
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = li.QuadPart;
#else
	struct STAT statbuf;
	if(FSTAT(m_fh,&statbuf)!=0)
	{
		LCSETREALLASTERROR(EBADF, _T("unable to get file size"));
		return false;
	}
	m_filesize = statbuf.st_size;
#endif

	// Exit now for empty files
	if (m_filesize == 0)
	{
		linecount = 0;
		return true;
	}

	// Figure out actual thread count
	tlc_fileoffset_t windowcount = (m_filesize + (m_parameters.buffersize - 1)) / m_parameters.buffersize;
	if (windowcount < (tlc_fileoffset_t) m_parameters.threadcount)
	{
		m_actual_thread_count = (int)windowcount;
	}
	else
	{
		m_actual_thread_count = m_parameters.threadcount;
	}

//	printf("act: %d\n",m_actual_thread_count);

#ifdef _WIN32
	// Prepare file mapping
	m_filemapping = CreateFileMapping(m_fh, NULL, PAGE_READONLY, 0, 0, NULL);
#endif

	// Spin up threads
	m_threads.resize(m_actual_thread_count);
	m_threadlinecounts.resize(m_actual_thread_count);
	m_thread_fail = false;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		if (!createThread(i))
		{
			setLastError(ECHILD, _T("failed to create counting thread"));
			
			m_thread_fail = true;

			m_actual_thread_count = i;
			break;
		}
	}

	// Wait for threads to complete
	int complete = 0;
	int errors = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		bool success = false;

#ifdef _WIN32
		success = (WaitForSingleObject(m_threads[i], INFINITE) == WAIT_OBJECT_0);
#else
		success = pthread_join(m_threads[i], NULL) == 0;
#endif
	
		if (success)
		{
			complete++;
		}
		else
		{
			errors++;
		}
	}

#ifdef _WIN32
	// Clean up file mapping
	CloseHandle(m_filemapping);
#endif

	if (m_thread_fail)
	{
		return false;
	}

	if (complete != m_actual_thread_count)
	{
		setLastError(ECHILD, _T("thread join failed"));
		return false;
	}

	// Sum up thread line counts and return
	linecount = 0;
	for (int i = 0; i < m_actual_thread_count; i++)
	{
		linecount += m_threadlinecounts[i];
	}
	
	return true;
}